

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_uuid.cpp
# Opt level: O0

wchar_t * ON_UuidToString(ON_UUID *uuid,wchar_t *s)

{
  char *pcVar1;
  int local_4c;
  char local_48 [4];
  int i;
  char x [37];
  wchar_t *local_18;
  wchar_t *s_local;
  ON_UUID *uuid_local;
  
  if ((s == (wchar_t *)0x0) || (pcVar1 = ON_UuidToString(uuid,local_48), pcVar1 == (char *)0x0)) {
    local_18 = (wchar_t *)0x0;
  }
  else {
    for (local_4c = 0; local_18 = s, local_4c < 0x25; local_4c = local_4c + 1) {
      s[local_4c] = (int)local_48[local_4c];
    }
  }
  return local_18;
}

Assistant:

wchar_t* ON_UuidToString( const ON_UUID& uuid, wchar_t* s)
{
  // s - [out]  The s[] char array must have length >= 37.  
  //            The returned char array will have a 36 
  //            character uuid in s[0..35] and a null in s[36].

  // NOTE WELL: 
  //   This code has to work on non-Windows OSs and on both big and
  //   little endian CPUs.  The result must satisfy
  //   uuid == ON_UuidFromString(ON_UuidToString(uuid,s))
  char x[37];
  if ( s && ON_UuidToString(uuid,x) )
  {
    int i;
    for (i = 0; i < 37; i++ )
    {
      s[i] = (wchar_t)x[i];
    }
  }
  else
  {
    s = 0;
  }
  return s;
}